

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseEndTag1(xmlParserCtxtPtr ctxt,int line)

{
  xmlChar *local_20;
  xmlChar *name;
  int line_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '/')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    local_20 = xmlParseNameAndCompare(ctxt,ctxt->name);
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    if (((((*ctxt->input->cur < 9) || (10 < *ctxt->input->cur)) && (*ctxt->input->cur != '\r')) &&
        (*ctxt->input->cur < 0x20)) || (*ctxt->input->cur != '>')) {
      xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
    }
    else {
      ctxt->input->col = ctxt->input->col + 1;
      ctxt->input->cur = ctxt->input->cur + 1;
      if (*ctxt->input->cur == '\0') {
        xmlParserInputGrow(ctxt->input,0xfa);
      }
    }
    if (local_20 != (xmlChar *)0x1) {
      if (local_20 == (xmlChar *)0x0) {
        local_20 = "unparsable";
      }
      xmlFatalErrMsgStrIntStr
                (ctxt,XML_ERR_TAG_NAME_MISMATCH,
                 "Opening and ending tag mismatch: %s line %d and %s\n",ctxt->name,line,local_20);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endElement != (endElementSAXFunc)0x0))
       && (ctxt->disableSAX == 0)) {
      (*ctxt->sax->endElement)(ctxt->userData,ctxt->name);
    }
    namePop(ctxt);
    spacePop(ctxt);
  }
  else {
    xmlFatalErrMsg(ctxt,XML_ERR_LTSLASH_REQUIRED,"xmlParseEndTag: \'</\' not found\n");
  }
  return;
}

Assistant:

static void
xmlParseEndTag1(xmlParserCtxtPtr ctxt, int line) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErrMsg(ctxt, XML_ERR_LTSLASH_REQUIRED,
		       "xmlParseEndTag: '</' not found\n");
	return;
    }
    SKIP(2);

    name = xmlParseNameAndCompare(ctxt,ctxt->name);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
	(!ctxt->disableSAX))
        ctxt->sax->endElement(ctxt->userData, ctxt->name);

    namePop(ctxt);
    spacePop(ctxt);
    return;
}